

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_crypto_two_reg_sha512(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  uint uVar1;
  code *pcVar2;
  TCGTemp *ts;
  TCGTemp *pTVar3;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *tcg_ctx_1;
  uintptr_t o;
  TCGv_i64 ret;
  
  s_00 = s->uc->tcg_ctx;
  uVar1 = insn >> 10 & 3;
  if (uVar1 == 0) {
    if ((s->isar->id_aa64isar0 & 0xe000) == 0) goto LAB_006aee5b;
    pcVar2 = gen_helper_crypto_sha512su0;
  }
  else {
    if ((uVar1 != 1) || ((s->isar->id_aa64isar0 & 0xf0000000000) == 0)) {
LAB_006aee5b:
      unallocated_encoding_aarch64(s);
      return;
    }
    pcVar2 = gen_helper_crypto_sm4e;
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_aarch64
            (s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)s_00->cpu_env,
             (ulong)((insn & 0x1f) * 0x100 + 0xc10));
  s_01 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar3 - (long)s_01);
  tcg_gen_addi_i64_aarch64(s_01,ret,(TCGv_i64)s_01->cpu_env,(ulong)((insn & 0x3e0) * 8 + 0xc10));
  (*pcVar2)(s_00,(TCGv_i64)((long)ts - (long)s_00),ret);
  tcg_temp_free_internal_aarch64(s_00,ts);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
  return;
}

Assistant:

static void disas_crypto_two_reg_sha512(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode = extract32(insn, 10, 2);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr;
    bool feature;
    CryptoTwoOpFn *genfn;

    switch (opcode) {
    case 0: /* SHA512SU0 */
        feature = dc_isar_feature(aa64_sha512, s);
        genfn = gen_helper_crypto_sha512su0;
        break;
    case 1: /* SM4E */
        feature = dc_isar_feature(aa64_sm4, s);
        genfn = gen_helper_crypto_sm4e;
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);

    genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr);

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
}